

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O2

bool cmScanDepFormat_P1689_Write(string *path,cmScanDepInfo *info)

{
  byte bVar1;
  int iVar2;
  pointer pbVar3;
  pointer pcVar4;
  Value *pVVar5;
  Value *pVVar6;
  string *psVar7;
  char *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  pointer path_00;
  Value local_348;
  Value *local_320;
  string *local_318;
  Value rule;
  Value ddi;
  Value encoded;
  cmGeneratedFileStream ddif;
  
  local_318 = path;
  Json::Value::Value(&ddi,objectValue);
  Json::Value::Value((Value *)&ddif,0);
  pVVar5 = Json::Value::operator[](&ddi,"version");
  Json::Value::operator=(pVVar5,(Value *)&ddif);
  Json::Value::~Value((Value *)&ddif);
  Json::Value::Value((Value *)&ddif,0);
  pVVar5 = Json::Value::operator[](&ddi,"revision");
  Json::Value::operator=(pVVar5,(Value *)&ddif);
  Json::Value::~Value((Value *)&ddif);
  Json::Value::Value((Value *)&ddif,arrayValue);
  pVVar5 = Json::Value::operator[](&ddi,"rules");
  local_320 = Json::Value::operator=(pVVar5,(Value *)&ddif);
  Json::Value::~Value((Value *)&ddif);
  Json::Value::Value(&rule,objectValue);
  EncodeFilename((Value *)&ddif,&info->PrimaryOutput);
  pVVar5 = Json::Value::operator[](&rule,"primary-output");
  Json::Value::operator=(pVVar5,(Value *)&ddif);
  Json::Value::~Value((Value *)&ddif);
  Json::Value::Value((Value *)&ddif,arrayValue);
  pVVar5 = Json::Value::operator[](&rule,"outputs");
  pVVar5 = Json::Value::operator=(pVVar5,(Value *)&ddif);
  Json::Value::~Value((Value *)&ddif);
  pbVar3 = (info->ExtraOutputs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (path_00 = (info->ExtraOutputs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; path_00 != pbVar3; path_00 = path_00 + 1
      ) {
    EncodeFilename((Value *)&ddif,path_00);
    Json::Value::append(pVVar5,(Value *)&ddif);
    Json::Value::~Value((Value *)&ddif);
  }
  Json::Value::Value((Value *)&ddif,arrayValue);
  pVVar5 = Json::Value::operator[](&rule,"provides");
  pVVar5 = Json::Value::operator=(pVVar5,(Value *)&ddif);
  Json::Value::~Value((Value *)&ddif);
  pcVar4 = (info->Provides).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar7 = &((info->Provides).
                  super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                  super__Vector_impl_data._M_start)->SourcePath; (pointer)(psVar7 + -1) != pcVar4;
      psVar7 = (string *)&psVar7[3]._M_string_length) {
    Json::Value::Value((Value *)&ddif,objectValue);
    EncodeFilename(&encoded,psVar7 + -1);
    pVVar6 = Json::Value::operator[]((Value *)&ddif,"logical-name");
    Json::Value::operator=(pVVar6,&encoded);
    if (psVar7[1]._M_string_length != 0) {
      EncodeFilename(&local_348,psVar7 + 1);
      pVVar6 = Json::Value::operator[]((Value *)&ddif,"compiled-module-path");
      Json::Value::operator=(pVVar6,&local_348);
      Json::Value::~Value(&local_348);
    }
    if (*(char *)&psVar7[2]._M_dataplus._M_p == '\x01') {
      Json::Value::Value(&local_348,true);
      pVVar6 = Json::Value::operator[]((Value *)&ddif,"unique-on-source-path");
      Json::Value::operator=(pVVar6,&local_348);
      Json::Value::~Value(&local_348);
      EncodeFilename(&local_348,psVar7);
      pVVar6 = Json::Value::operator[]((Value *)&ddif,"source-path");
LAB_0046dd10:
      Json::Value::operator=(pVVar6,&local_348);
      Json::Value::~Value(&local_348);
    }
    else if (psVar7->_M_string_length != 0) {
      EncodeFilename(&local_348,psVar7);
      pVVar6 = Json::Value::operator[]((Value *)&ddif,"source-path");
      goto LAB_0046dd10;
    }
    Json::Value::Value(&local_348,*(bool *)((long)&psVar7[2]._M_dataplus._M_p + 1));
    pVVar6 = Json::Value::operator[]((Value *)&ddif,"is-interface");
    Json::Value::operator=(pVVar6,&local_348);
    Json::Value::~Value(&local_348);
    Json::Value::append(pVVar5,(Value *)&ddif);
    Json::Value::~Value(&encoded);
    Json::Value::~Value((Value *)&ddif);
  }
  Json::Value::Value((Value *)&ddif,arrayValue);
  pVVar5 = Json::Value::operator[](&rule,"requires");
  pVVar5 = Json::Value::operator=(pVVar5,(Value *)&ddif);
  Json::Value::~Value((Value *)&ddif);
  pcVar4 = (info->Requires).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  psVar7 = &((info->Requires).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
             _M_impl.super__Vector_impl_data._M_start)->SourcePath;
  do {
    if ((pointer)(psVar7 + -1) == pcVar4) {
      Json::Value::append(local_320,&rule);
      cmGeneratedFileStream::cmGeneratedFileStream(&ddif,local_318,false,None);
      Json::operator<<((OStream *)&ddif,&ddi);
      bVar1 = (&ddif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
              [(long)ddif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                     _vptr_basic_ostream[-3]];
      cmGeneratedFileStream::~cmGeneratedFileStream(&ddif);
      Json::Value::~Value(&rule);
      Json::Value::~Value(&ddi);
      return (bVar1 & 5) == 0;
    }
    Json::Value::Value((Value *)&ddif,objectValue);
    EncodeFilename(&encoded,psVar7 + -1);
    pVVar6 = Json::Value::operator[]((Value *)&ddif,"logical-name");
    Json::Value::operator=(pVVar6,&encoded);
    if (psVar7[1]._M_string_length != 0) {
      EncodeFilename(&local_348,psVar7 + 1);
      pVVar6 = Json::Value::operator[]((Value *)&ddif,"compiled-module-path");
      Json::Value::operator=(pVVar6,&local_348);
      Json::Value::~Value(&local_348);
    }
    if (*(char *)&psVar7[2]._M_dataplus._M_p == '\x01') {
      Json::Value::Value(&local_348,true);
      pVVar6 = Json::Value::operator[]((Value *)&ddif,"unique-on-source-path");
      Json::Value::operator=(pVVar6,&local_348);
      Json::Value::~Value(&local_348);
      EncodeFilename(&local_348,psVar7);
      pVVar6 = Json::Value::operator[]((Value *)&ddif,"source-path");
LAB_0046deb9:
      Json::Value::operator=(pVVar6,&local_348);
      Json::Value::~Value(&local_348);
    }
    else if (psVar7->_M_string_length != 0) {
      EncodeFilename(&local_348,psVar7);
      pVVar6 = Json::Value::operator[]((Value *)&ddif,"source-path");
      goto LAB_0046deb9;
    }
    iVar2 = *(int *)((long)&psVar7[2]._M_dataplus._M_p + 4);
    value = "include-angle";
    if (iVar2 == 1) {
LAB_0046dee8:
      Json::Value::Value(&local_348,value);
      pVVar6 = Json::Value::operator[]((Value *)&ddif,"lookup-method");
      Json::Value::operator=(pVVar6,&local_348);
      Json::Value::~Value(&local_348);
    }
    else if (iVar2 == 2) {
      value = "include-quote";
      goto LAB_0046dee8;
    }
    Json::Value::append(pVVar5,(Value *)&ddif);
    Json::Value::~Value(&encoded);
    Json::Value::~Value((Value *)&ddif);
    psVar7 = (string *)&psVar7[3]._M_string_length;
  } while( true );
}

Assistant:

bool cmScanDepFormat_P1689_Write(std::string const& path,
                                 cmScanDepInfo const& info)
{
  Json::Value ddi(Json::objectValue);
  ddi["version"] = 0;
  ddi["revision"] = 0;

  Json::Value& rules = ddi["rules"] = Json::arrayValue;

  Json::Value rule(Json::objectValue);

  rule["primary-output"] = EncodeFilename(info.PrimaryOutput);

  Json::Value& rule_outputs = rule["outputs"] = Json::arrayValue;
  for (auto const& output : info.ExtraOutputs) {
    rule_outputs.append(EncodeFilename(output));
  }

  Json::Value& provides = rule["provides"] = Json::arrayValue;
  for (auto const& provide : info.Provides) {
    Json::Value provide_obj(Json::objectValue);
    auto const encoded = EncodeFilename(provide.LogicalName);
    provide_obj["logical-name"] = encoded;
    if (!provide.CompiledModulePath.empty()) {
      provide_obj["compiled-module-path"] =
        EncodeFilename(provide.CompiledModulePath);
    }

    if (provide.UseSourcePath) {
      provide_obj["unique-on-source-path"] = true;
      provide_obj["source-path"] = EncodeFilename(provide.SourcePath);
    } else if (!provide.SourcePath.empty()) {
      provide_obj["source-path"] = EncodeFilename(provide.SourcePath);
    }

    provide_obj["is-interface"] = provide.IsInterface;

    provides.append(provide_obj);
  }

  Json::Value& reqs = rule["requires"] = Json::arrayValue;
  for (auto const& require : info.Requires) {
    Json::Value require_obj(Json::objectValue);
    auto const encoded = EncodeFilename(require.LogicalName);
    require_obj["logical-name"] = encoded;
    if (!require.CompiledModulePath.empty()) {
      require_obj["compiled-module-path"] =
        EncodeFilename(require.CompiledModulePath);
    }

    if (require.UseSourcePath) {
      require_obj["unique-on-source-path"] = true;
      require_obj["source-path"] = EncodeFilename(require.SourcePath);
    } else if (!require.SourcePath.empty()) {
      require_obj["source-path"] = EncodeFilename(require.SourcePath);
    }

    const char* lookup_method = nullptr;
    switch (require.Method) {
      case LookupMethod::ByName:
        // No explicit value needed for the default.
        break;
      case LookupMethod::IncludeAngle:
        lookup_method = "include-angle";
        break;
      case LookupMethod::IncludeQuote:
        lookup_method = "include-quote";
        break;
    }
    if (lookup_method) {
      require_obj["lookup-method"] = lookup_method;
    }

    reqs.append(require_obj);
  }

  rules.append(rule);

  cmGeneratedFileStream ddif(path);
  ddif << ddi;

  return !!ddif;
}